

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  ZSTD_CCtx_params in_stack_ffffffffffffff68;
  
  auVar6._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar6._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar6._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar6._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar2 = movmskps(dictContentType,auVar6);
  uVar1 = 0xffffffffffffffd6;
  if ((iVar2 == 0xf) && (0xfffffffa < params.cParams.searchLength - 8)) {
    if (params.cParams.targetLength == 0) {
      uVar1 = 0xffffffffffffffd8;
    }
    else {
      uVar1 = 0xffffffffffffffd8;
      if (params.cParams.strategy < (ZSTD_btultra|ZSTD_fast)) {
        uVar1 = 0;
      }
    }
  }
  if (uVar1 < 0xffffffffffffff89) {
    pZVar4 = &params;
    puVar5 = (undefined8 *)&stack0xffffffffffffff68;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)pZVar4;
      pZVar4 = (ZSTD_CCtx_params *)&(pZVar4->cParams).chainLog;
      puVar5 = puVar5 + 1;
    }
    uVar1 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,in_stack_ffffffffffffff68,
                       pledgedSrcSize,ZSTDb_not_buffered);
  }
  return uVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params.cParams.windowLog);
    /* compression parameters verification and optimization */
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}